

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_or_many(size_t number,roaring_bitmap_t **x)

{
  roaring_bitmap_t *prVar1;
  size_t i;
  ulong uVar2;
  
  if (number == 1) {
    prVar1 = roaring_bitmap_copy(*x);
    return prVar1;
  }
  if (number == 0) {
    prVar1 = roaring_bitmap_create();
    return prVar1;
  }
  prVar1 = roaring_bitmap_lazy_or(*x,x[1],true);
  for (uVar2 = 2; uVar2 < number; uVar2 = uVar2 + 1) {
    roaring_bitmap_lazy_or_inplace(prVar1,x[uVar2],true);
  }
  roaring_bitmap_repair_after_lazy(prVar1);
  return prVar1;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many(size_t number,
                                         const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_lazy_or(x[0], x[1], LAZY_OR_BITSET_CONVERSION);
    for (size_t i = 2; i < number; i++) {
        roaring_bitmap_lazy_or_inplace(answer, x[i], LAZY_OR_BITSET_CONVERSION);
    }
    roaring_bitmap_repair_after_lazy(answer);
    return answer;
}